

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O1

void __thiscall
chrono::ChBody::IntLoadResidual_F(ChBody *this,uint off,ChVectorDynamic<> *R,double c)

{
  Index index_1;
  double *pdVar1;
  Index index;
  ulong uVar2;
  ulong uVar3;
  ChVector<double> v;
  double local_18 [3];
  
  if ((long)(ulong)off <=
      (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3) {
    pdVar1 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
             off;
    uVar2 = 3;
    if ((((ulong)pdVar1 & 7) == 0) &&
       (uVar3 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), uVar3 < 3)) {
      uVar2 = uVar3;
    }
    if (uVar2 != 0) {
      uVar3 = 0;
      do {
        pdVar1[uVar3] = c * (this->Xforce).m_data[uVar3] + pdVar1[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    if (uVar2 < 3) {
      do {
        pdVar1[uVar2] = c * (this->Xforce).m_data[uVar2] + pdVar1[uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar2 != 3);
    }
    if ((this->bflags & 0x800) == 0) {
      local_18[0] = (this->Xtorque).m_data[0] - (this->gyro).m_data[0];
      local_18[1] = (this->Xtorque).m_data[1] - (this->gyro).m_data[1];
      local_18[2] = (this->Xtorque).m_data[2] - (this->gyro).m_data[2];
      if ((long)(ulong)(off + 3) <=
          (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3)
      {
        pdVar1 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data + (off + 3);
        uVar2 = 3;
        if ((((ulong)pdVar1 & 7) == 0) &&
           (uVar3 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), uVar3 < 3)) {
          uVar2 = uVar3;
        }
        if (uVar2 != 0) {
          uVar3 = 0;
          do {
            pdVar1[uVar3] = c * local_18[uVar3] + pdVar1[uVar3];
            uVar3 = uVar3 + 1;
          } while (uVar2 != uVar3);
        }
        if (uVar2 < 3) {
          do {
            pdVar1[uVar2] = c * local_18[uVar2] + pdVar1[uVar2];
            uVar2 = uVar2 + 1;
          } while (uVar2 != 3);
        }
        return;
      }
    }
    else if ((long)(ulong)(off + 3) <=
             (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows +
             -3) {
      pdVar1 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               + (off + 3);
      uVar2 = 3;
      if ((((ulong)pdVar1 & 7) == 0) &&
         (uVar3 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), uVar3 < 3)) {
        uVar2 = uVar3;
      }
      if (uVar2 != 0) {
        uVar3 = 0;
        do {
          pdVar1[uVar3] = c * (this->Xtorque).m_data[uVar3] + pdVar1[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar2 != uVar3);
      }
      if (2 < uVar2) {
        return;
      }
      do {
        pdVar1[uVar2] = c * (this->Xtorque).m_data[uVar2] + pdVar1[uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar2 != 3);
      return;
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChBody::IntLoadResidual_F(const unsigned int off,  // offset in R residual
                               ChVectorDynamic<>& R,    // result: the R residual, R += c*F
                               const double c           // a scaling factor
) {
    // add applied forces to 'fb' vector
    R.segment(off, 3) += c * Xforce.eigen();

    // add applied torques to 'fb' vector, including gyroscopic torque
    if (this->GetNoGyroTorque())
        R.segment(off + 3, 3) += c * Xtorque.eigen();
    else
        R.segment(off + 3, 3) += c * (Xtorque - gyro).eigen();
}